

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<-25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<-9>,_boost::random::detail::M3<-21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>,_3006934229U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<_25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<_9>,_boost::random::detail::M3<_21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>,_3006934229U>
           *this)

{
  type __n;
  type last;
  int local_9f0;
  result_type local_9ec;
  int iterations;
  result_type x;
  uint *p;
  uint local_9d8 [2];
  uint state [624];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<_25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<_9>,_boost::random::detail::M3<_21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>,_3006934229U>
  *this_local;
  
  __n = boost::size<unsigned_int[624]>((uint (*) [624])local_9d8);
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_9d8,__n,(int *)((long)&p + 4));
  _iterations = local_9d8;
  last = boost::range_adl_barrier::end<unsigned_int[624]>((uint (*) [624])local_9d8);
  boost::random::
  well_engine<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,boost::random::detail::M3<-25>,boost::random::detail::M3<27>,boost::random::detail::M2<9>,boost::random::detail::M3<1>,boost::random::detail::M1,boost::random::detail::M3<-9>,boost::random::detail::M3<-21>,boost::random::detail::M3<21>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,boost::random::detail::M3<_25>,boost::random::detail::M3<27>,boost::random::detail::M2<9>,boost::random::detail::M3<1>,boost::random::detail::M1,boost::random::detail::M3<_9>,boost::random::detail::M3<_21>,boost::random::detail::M3<21>,boost::random::detail::no_tempering>
              *)this,(uint **)&iterations,last);
  local_9f0 = 1000000000;
  while (0 < local_9f0) {
    local_9ec = boost::random::
                well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<-25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<-9>,_boost::random::detail::M3<-21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>
                ::operator()(&this->rng);
    local_9f0 = local_9f0 + -1;
  }
  return local_9ec;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }